

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxwritestate.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeState(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,char *filename,NameSet *rowNames,NameSet *colNames,bool cpxFormat,
            bool writeZeroObjective)

{
  uint *puVar1;
  Real RVar2;
  char *pcVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  double *pdVar7;
  long *plVar8;
  undefined1 uVar9;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  string ofname;
  ofstream ofs;
  allocator local_2c1;
  long *local_2c0 [2];
  long local_2b0 [2];
  undefined4 local_2a0;
  undefined4 local_29c;
  NameSet *local_298;
  NameSet *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_280 = 0;
  local_278 = 0;
  local_298 = rowNames;
  local_290 = colNames;
  local_288 = &local_278;
  std::ofstream::ofstream(&local_230);
  std::__cxx11::string::string((string *)local_2c0,filename,&local_2c1);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_2c0);
  puVar1 = local_268.m_backend.data._M_elems + 4;
  plVar8 = plVar5 + 2;
  if ((uint *)*plVar5 == (uint *)plVar8) {
    local_268.m_backend.data._M_elems._16_8_ = *plVar8;
    local_268.m_backend.data._M_elems._24_5_ = SUB85(plVar5[3],0);
    local_268.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)plVar5[3] >> 0x28);
    local_268.m_backend.data._M_elems._0_8_ = puVar1;
  }
  else {
    local_268.m_backend.data._M_elems._16_8_ = *plVar8;
    local_268.m_backend.data._M_elems._0_8_ = (uint *)*plVar5;
  }
  local_29c = (undefined4)CONCAT71(in_register_00000089,writeZeroObjective);
  local_2a0 = (undefined4)CONCAT71(in_register_00000081,cpxFormat);
  local_268.m_backend.data._M_elems._8_8_ = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_288,(string *)&local_268);
  if ((uint *)local_268.m_backend.data._M_elems._0_8_ != puVar1) {
    operator_delete((void *)local_268.m_backend.data._M_elems._0_8_,
                    local_268.m_backend.data._M_elems._16_8_ + 1);
  }
  if (local_2c0[0] != local_2b0) {
    operator_delete(local_2c0[0],local_2b0[0] + 1);
  }
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_288);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# SoPlex version ",0x11);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_230,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    plVar5 = (long *)std::ostream::operator<<((ostream *)poVar6,0);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    plVar5 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# run SoPlex as follows:",0x18);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               "# bin/soplex --loadset=spxcheck.set --readbas=spxcheck.bas spxcheck.mps\n",0x48);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"int:representation = ",0x15);
    pcVar3 = 
    "7.275957614183425903320312500000000000000000000000000000000000000000000000000000000000000000000000000e-12"
    ;
    if (this->theRep == COLUMN) {
      pcVar3 = 
      "5.820766091346740722656250000000000000000000000000000000000000000000000000000000000000000000000000000e-11"
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar3 + 0x68,1);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"int:factor_update_max = ",0x18);
    plVar5 = (long *)std::ostream::operator<<
                               ((ostream *)&local_230,
                                (this->
                                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).maxUpdates);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"int:pricer = ",0xd);
    iVar4 = (**this->thepricer->_vptr_SPxPricer)();
    iVar4 = strcmp((char *)CONCAT44(extraout_var,iVar4),"Auto");
    if (iVar4 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," 0",2);
LAB_002506f3:
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    else {
      iVar4 = (**this->thepricer->_vptr_SPxPricer)();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"Dantzig");
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"1",1);
        goto LAB_002506f3;
      }
      iVar4 = (**this->thepricer->_vptr_SPxPricer)();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"ParMult");
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"2",1);
        goto LAB_002506f3;
      }
      iVar4 = (**this->thepricer->_vptr_SPxPricer)();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_02,iVar4),"Devex");
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"3",1);
        goto LAB_002506f3;
      }
      iVar4 = (**this->thepricer->_vptr_SPxPricer)();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_03,iVar4),"Steep");
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"4",1);
        goto LAB_002506f3;
      }
      iVar4 = (**this->thepricer->_vptr_SPxPricer)();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_04,iVar4),"SteepEx");
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"5",1);
        std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"int:ratiotester = ",0x12);
    iVar4 = (**this->theratiotester->_vptr_SPxRatioTester)();
    iVar4 = strcmp((char *)CONCAT44(extraout_var_05,iVar4),"Default");
    if (iVar4 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"0",1);
LAB_0025082a:
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    else {
      iVar4 = (**this->theratiotester->_vptr_SPxRatioTester)();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_06,iVar4),"Harris");
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"1",1);
        goto LAB_0025082a;
      }
      iVar4 = (**this->theratiotester->_vptr_SPxRatioTester)();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_07,iVar4),"Fast");
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"2",1);
        goto LAB_0025082a;
      }
      iVar4 = (**this->theratiotester->_vptr_SPxRatioTester)();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_08,iVar4),"Bound Flipping");
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"3",1);
        goto LAB_0025082a;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"real:feastol = ",0xf);
    RVar2 = Tolerances::floatingPointFeastol
                      ((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    poVar6 = std::ostream::_M_insert<double>(RVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"real:opttol = ",0xe);
    RVar2 = Tolerances::floatingPointOpttol
                      ((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    poVar6 = std::ostream::_M_insert<double>(RVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"real:epsilon_zero = ",0x14);
    RVar2 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    local_268.m_backend.fpclass = cpp_dec_float_finite;
    local_268.m_backend.prec_elem = 10;
    local_268.m_backend.data._M_elems[0] = 0;
    local_268.m_backend.data._M_elems[1] = 0;
    local_268.m_backend.data._M_elems[2] = 0;
    local_268.m_backend.data._M_elems[3] = 0;
    local_268.m_backend.data._M_elems[4] = 0;
    local_268.m_backend.data._M_elems[5] = 0;
    local_268.m_backend.data._M_elems._24_5_ = 0;
    local_268.m_backend.data._M_elems[7]._1_3_ = 0;
    local_268.m_backend.data._M_elems._32_5_ = 0;
    local_268.m_backend._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_268,RVar2);
    poVar6 = boost::multiprecision::operator<<((ostream *)&local_230,&local_268);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"real:infty = ",0xd);
    ::soplex::infinity::__tls_init();
    pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
    poVar6 = std::ostream::_M_insert<double>(*pdVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"uint:random_seed = ",0x13);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::ofstream::close();
    std::__cxx11::string::string((string *)local_2c0,filename,&local_2c1);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_2c0);
    plVar8 = plVar5 + 2;
    if ((uint *)*plVar5 == (uint *)plVar8) {
      local_268.m_backend.data._M_elems._16_8_ = *plVar8;
      local_268.m_backend.data._M_elems._24_5_ = SUB85(plVar5[3],0);
      local_268.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)plVar5[3] >> 0x28);
      local_268.m_backend.data._M_elems._0_8_ = puVar1;
    }
    else {
      local_268.m_backend.data._M_elems._16_8_ = *plVar8;
      local_268.m_backend.data._M_elems._0_8_ = (uint *)*plVar5;
    }
    local_268.m_backend.data._M_elems._8_8_ = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_268);
    if ((uint *)local_268.m_backend.data._M_elems._0_8_ != puVar1) {
      operator_delete((void *)local_268.m_backend.data._M_elems._0_8_,
                      local_268.m_backend.data._M_elems._16_8_ + 1);
    }
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0],local_2b0[0] + 1);
    }
    std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_288);
    if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x21])(this,&local_230,local_298,local_290,0,(ulong)(byte)local_29c);
      std::ofstream::close();
      std::__cxx11::string::string((string *)local_2c0,filename,&local_2c1);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_2c0);
      plVar8 = plVar5 + 2;
      if ((uint *)*plVar5 == (uint *)plVar8) {
        local_268.m_backend.data._M_elems._16_8_ = *plVar8;
        local_268.m_backend.data._M_elems._24_5_ = SUB85(plVar5[3],0);
        local_268.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)plVar5[3] >> 0x28);
        local_268.m_backend.data._M_elems._0_8_ = puVar1;
      }
      else {
        local_268.m_backend.data._M_elems._16_8_ = *plVar8;
        local_268.m_backend.data._M_elems._0_8_ = (uint *)*plVar5;
      }
      local_268.m_backend.data._M_elems._8_8_ = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_288,(string *)&local_268);
      if ((uint *)local_268.m_backend.data._M_elems._0_8_ != puVar1) {
        operator_delete((void *)local_268.m_backend.data._M_elems._0_8_,
                        local_268.m_backend.data._M_elems._16_8_ + 1);
      }
      if (local_2c0[0] != local_2b0) {
        operator_delete(local_2c0[0],local_2b0[0] + 1);
      }
      iVar4 = (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x5b])(this,local_288,local_298,local_290,(ulong)(byte)local_2a0);
      uVar9 = (undefined1)iVar4;
      goto LAB_00250b42;
    }
  }
  uVar9 = 0;
LAB_00250b42:
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  return (bool)uVar9;
}

Assistant:

bool SPxSolverBase<R>::writeState(
   const char*    filename,
   const NameSet* rowNames,
   const NameSet* colNames,
   const bool     cpxFormat,
   const bool     writeZeroObjective
) const
{

   std::string ofname;
   std::ofstream ofs;

   // write parameter settings
   ofname = std::string(filename) + ".set";
   ofs.open(ofname.c_str());

   if(!ofs)
      return false;

   ofs << "# SoPlex version " << SOPLEX_VERSION / 100
       << "." << (SOPLEX_VERSION / 10) % 10
       << "." << SOPLEX_VERSION % 10 << std::endl << std::endl;
   ofs << "# run SoPlex as follows:" << std::endl;
   ofs << "# bin/soplex --loadset=spxcheck.set --readbas=spxcheck.bas spxcheck.mps\n" << std::endl;
   ofs << "int:representation = " << (rep() == SPxSolverBase<R>::COLUMN ? "1" : "2") << std::endl;
   ofs << "int:factor_update_max = " << basis().getMaxUpdates() << std::endl;
   ofs << "int:pricer = ";

   if(!strcmp(pricer()->getName(), "Auto"))
      ofs << " 0" << std::endl;
   else if(!strcmp(pricer()->getName(), "Dantzig"))
      ofs << "1" << std::endl;
   else if(!strcmp(pricer()->getName(), "ParMult"))
      ofs << "2" << std::endl;
   else if(!strcmp(pricer()->getName(), "Devex"))
      ofs << "3" << std::endl;
   else if(!strcmp(pricer()->getName(), "Steep"))
      ofs << "4" << std::endl;
   else if(!strcmp(pricer()->getName(), "SteepEx"))
      ofs << "5" << std::endl;

   ofs << "int:ratiotester = ";

   if(!strcmp(ratiotester()->getName(), "Default"))
      ofs << "0" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Harris"))
      ofs << "1" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Fast"))
      ofs << "2" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Bound Flipping"))
      ofs << "3" << std::endl;

   ofs << "real:feastol = " << tolerances()->floatingPointFeastol() << std::endl;
   ofs << "real:opttol = " << tolerances()->floatingPointOpttol() << std::endl;
   ofs << "real:epsilon_zero = " << epsilon() << std::endl;
   ofs << "real:infty = " << infinity << std::endl;
   ofs << "uint:random_seed = " << random.getSeed() << std::endl;
   ofs.close();

   // write LP
   ofname = std::string(filename) + ".mps";
   ofs.open(ofname.c_str());

   if(!ofs)
      return false;

   this->writeMPS(ofs, rowNames, colNames, nullptr, writeZeroObjective);
   ofs.close();

   // write basis
   ofname = std::string(filename) + ".bas";
   return writeBasisFile(ofname.c_str(), rowNames, colNames, cpxFormat);
}